

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket_location_handler.c
# Opt level: O3

int main(void)

{
  int iVar1;
  
  UnityBegin(
            "/workspace/llm4binary/github/license_c_cmakelists/gatzka[P]cio/tests/test_websocket_location_handler.c"
            );
  UnityDefaultTestRun(test_ws_location_init_fails,"test_ws_location_init_fails",0x2f6);
  UnityDefaultTestRun(test_ws_location_init_ok,"test_ws_location_init_ok",0x2f7);
  UnityDefaultTestRun(test_ws_location_ws_init_fails,"test_ws_location_ws_init_fails",0x2f8);
  UnityDefaultTestRun(test_free_resources,"test_free_resources",0x2f9);
  UnityDefaultTestRun(test_ws_location_http_versions,"test_ws_location_http_versions",0x2fb);
  UnityDefaultTestRun(test_ws_location_wrong_http_method,"test_ws_location_wrong_http_method",0x2fd)
  ;
  UnityDefaultTestRun(test_ws_location_no_http_upgrade,"test_ws_location_no_http_upgrade",0x2fe);
  UnityDefaultTestRun(test_ws_location_wrong_http_headers,"test_ws_location_wrong_http_headers",
                      0x2ff);
  UnityDefaultTestRun(test_ws_location_send_response_fails,"test_ws_location_send_response_fails",
                      0x300);
  UnityDefaultTestRun(test_ws_location_response_written_fails,
                      "test_ws_location_response_written_fails",0x301);
  UnityDefaultTestRun(test_ws_location_sub_protocols,"test_ws_location_sub_protocols",0x303);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

int main(void)
{
	UNITY_BEGIN();

	RUN_TEST(test_ws_location_init_fails);
	RUN_TEST(test_ws_location_init_ok);
	RUN_TEST(test_ws_location_ws_init_fails);
	RUN_TEST(test_free_resources);

	RUN_TEST(test_ws_location_http_versions);

	RUN_TEST(test_ws_location_wrong_http_method);
	RUN_TEST(test_ws_location_no_http_upgrade);
	RUN_TEST(test_ws_location_wrong_http_headers);
	RUN_TEST(test_ws_location_send_response_fails);
	RUN_TEST(test_ws_location_response_written_fails);

	RUN_TEST(test_ws_location_sub_protocols);

	return UNITY_END();
}